

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.hpp
# Opt level: O3

API<Args::details::API<Args::CmdLine,_Args::Command,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>,_Args::AllOfGroup,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>
* __thiscall
Args::details::
API<Args::CmdLine,Args::Command,std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,false>
::addAllOfGroup<char_const(&)[7]>
          (API<Args::details::API<Args::CmdLine,_Args::Command,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>,_Args::AllOfGroup,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>
           *__return_storage_ptr__,
          API<Args::CmdLine,Args::Command,std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,false>
          *this,char (*name) [7],bool required)

{
  GroupIface *this_00;
  
  this_00 = (GroupIface *)operator_new(0x50);
  GroupIface::GroupIface<char_const(&)[7]>(this_00,name,required);
  (this_00->super_ArgIface)._vptr_ArgIface = (_func_int **)&PTR__GroupIface_001718a0;
  (**(code **)(**(long **)(this + 0x10) + 0x98))();
  if (this_00 != (GroupIface *)0x0) {
    (*(this_00->super_ArgIface)._vptr_ArgIface[1])();
  }
  __return_storage_ptr__->_vptr_API = (_func_int **)&PTR__API_00171970;
  __return_storage_ptr__->m_parent =
       (API<Args::CmdLine,_Args::Command,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>
        *)this;
  __return_storage_ptr__->m_self = (AllOfGroup *)this_00;
  return __return_storage_ptr__;
}

Assistant:

API< API< PARENT, Command, ARGPTR, false >, AllOfGroup, ARGPTR, false > addAllOfGroup(
		//! Name of the group.
		NAME && name,
		//! Is group required?
		bool required = false )
	{
		auto group = std::unique_ptr< AllOfGroup, details::Deleter< ArgIface > > (
			new AllOfGroup( std::forward< NAME > ( name ), required ),
			details::Deleter< ArgIface > ( true ) );

		AllOfGroup & g = *group;

		ARGPTR a = std::move( group );

		m_self.addArg( std::move( a ) );

		return API< API< PARENT, Command, ARGPTR, false >, AllOfGroup, ARGPTR, false >
			( *this, g );
	}